

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

int32_t conv_mcnpx_pdg2ssw(int32_t c)

{
  int iVar1;
  int iVar2;
  int local_20;
  int32_t Z;
  int32_t A;
  int32_t I;
  int i;
  int32_t absc;
  int32_t c_local;
  int local_4;
  
  local_20 = c;
  if (c < 0) {
    local_20 = -c;
  }
  if (local_20 < 0x3b9b1849) {
    for (i = 0; i < 0x23; i = i + 1) {
      if (conv_mcnpx_to_pdg_0to34[i] == c) {
        return i;
      }
    }
    for (i = 0; i < 0x23; i = i + 1) {
      if (conv_mcnpx_to_pdg_0to34[i] == -c) {
        return i + 400;
      }
    }
  }
  if ((local_20 < 0x3b9aca01) || (0x3c336076 < local_20)) {
    local_4 = 0;
  }
  else {
    iVar1 = (local_20 / 10) % 1000;
    iVar2 = ((local_20 / 10) / 1000) % 1000;
    if ((((local_20 % 10 == 0) && (iVar1 != 0)) && (iVar2 != 0)) && (iVar2 <= iVar1)) {
      local_4 = 0x23;
      if (c < 0) {
        local_4 = 0x1b3;
      }
      local_4 = (iVar2 + -1) * 1000000 + iVar1 * 1000 + local_4;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int32_t conv_mcnpx_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    int i;
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i]==c)
        return i;
    }
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i] == -c)
        return 400+i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( I || !A || !Z || Z>A )
      return 0;
    return (Z-1)*1000000 + A*1000 + ( c<0 ? 435 : 35 );
  }
  return 0;
}